

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_pressure_Test::TestBody(stringToUnits_pressure_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_228;
  Message local_220;
  allocator local_211;
  string local_210;
  precise_unit local_1f0;
  allocator local_1d9;
  string local_1d8;
  precise_unit local_1b8;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_3;
  Message local_190;
  allocator local_181;
  string local_180;
  precise_unit local_160;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  allocator local_129;
  string local_128;
  precise_unit local_108;
  allocator local_f1;
  string local_f0;
  precise_unit local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  allocator local_99;
  string local_98;
  precise_unit local_78 [2];
  allocator local_51;
  string local_50;
  precise_unit local_30;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  stringToUnits_pressure_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"M[HG]",&local_51);
  uVar2 = units::getDefaultFlags();
  local_30 = units::unit_from_string(&local_50,uVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"meter of mercury column",&local_99);
  uVar2 = units::getDefaultFlags();
  local_78[0] = units::unit_from_string(&local_98,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_20,"unit_from_string(\"M[HG]\")",
             "unit_from_string(\"meter of mercury column\")",&local_30,local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1e9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"M[HG]",&local_f1);
  local_d0 = units::unit_from_string(&local_f0,0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"meter of mercury column",&local_129);
  uVar2 = units::getDefaultFlags();
  local_108 = units::unit_from_string(&local_128,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_c0,"unit_from_string(\"M[HG]\", units::case_insensitive)",
             "unit_from_string(\"meter of mercury column\")",&local_d0,&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"millimeter_Hg_0C",&local_181);
  uVar2 = units::getDefaultFlags();
  local_160 = units::unit_from_string(&local_180,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_150,"unit_from_string(\"millimeter_Hg_0C\")",
             "precise::pressure::mmHg",&local_160,(precise_unit *)units::precise::pressure::mmHg);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ed,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"MM[HG]",&local_1d9);
  local_1b8 = units::unit_from_string(&local_1d8,0x200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_210,"millimeter of mercury column",&local_211);
  uVar2 = units::getDefaultFlags();
  local_1f0 = units::unit_from_string(&local_210,uVar2);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_1a8,"unit_from_string(\"MM[HG]\", units::case_insensitive)",
             "unit_from_string(\"millimeter of mercury column\")",&local_1b8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1f0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  return;
}

Assistant:

TEST(stringToUnits, pressure)
{
    EXPECT_EQ(
        unit_from_string("M[HG]"), unit_from_string("meter of mercury column"));
    EXPECT_EQ(
        unit_from_string("M[HG]", units::case_insensitive),
        unit_from_string("meter of mercury column"));
    EXPECT_EQ(unit_from_string("millimeter_Hg_0C"), precise::pressure::mmHg);
    EXPECT_EQ(
        unit_from_string("MM[HG]", units::case_insensitive),
        unit_from_string("millimeter of mercury column"));
}